

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attr.c
# Opt level: O1

void * add_to_tmp_buffer(AttrBuffer buf,uint size)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  void *pvVar4;
  uint uVar5;
  
  iVar1 = buf->tmp_buffer_in_use_size;
  uVar5 = size + iVar1;
  iVar2 = buf->tmp_buffer_size;
  if ((long)iVar2 == 0) {
    uVar3 = 0x80;
    if (0x80 < uVar5) {
      uVar3 = uVar5;
    }
    pvVar4 = malloc((long)(int)uVar3);
    buf->tmp_buffer = pvVar4;
    if (pvVar4 != (void *)0x0) {
      memset(pvVar4,0,(long)(int)uVar3);
    }
  }
  if ((long)iVar2 < (long)(ulong)uVar5) {
    pvVar4 = realloc(buf->tmp_buffer,(ulong)uVar5);
    buf->tmp_buffer = pvVar4;
    memset((void *)((long)buf->tmp_buffer_size + (long)pvVar4),0,
           (ulong)(uVar5 - buf->tmp_buffer_size));
    buf->tmp_buffer_size = uVar5;
  }
  if (buf->tmp_buffer == (void *)0x0) {
    buf->tmp_buffer_size = 0;
  }
  else {
    buf->tmp_buffer_in_use_size = uVar5;
  }
  return (void *)((long)buf->tmp_buffer + (long)iVar1);
}

Assistant:

static
void *
add_to_tmp_buffer(AttrBuffer buf, unsigned int size)
{
    int old_size = buf->tmp_buffer_in_use_size;
    size += old_size;

    if (buf->tmp_buffer_size == 0) {
	int tmp_size = Max(size, TMP_BUFFER_INIT_SIZE);
	buf->tmp_buffer = malloc(tmp_size * sizeof(char));
	if(buf->tmp_buffer) memset(buf->tmp_buffer, 0, tmp_size * sizeof(char));
    }
    if ((long)size > (long)buf->tmp_buffer_size) {
	buf->tmp_buffer = realloc(buf->tmp_buffer, size);
	memset (((char*)buf->tmp_buffer) + buf->tmp_buffer_size, 0, size - buf->tmp_buffer_size);
	buf->tmp_buffer_size = size;
    }
    if (!buf->tmp_buffer) {
	buf->tmp_buffer_size = 0;
    } else {
	buf->tmp_buffer_in_use_size = size;
    }

    return old_size + (char*)buf->tmp_buffer;
}